

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O2

void Minisat::sort<int,Minisat::LessThan_default<int>>(int *array,ulong param_2)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  int *__dest;
  uint uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int *piVar17;
  ulong uVar18;
  
  param_2 = param_2 & 0xffffffff;
  while( true ) {
    uVar10 = (uint)param_2;
    if ((int)uVar10 < 0x10) {
      selectionSort<int,Minisat::LessThan_default<int>>(array,param_2);
      return;
    }
    if (0x20 < uVar10) break;
    iVar11 = array[param_2 >> 1];
    uVar18 = 0xffffffffffffffff;
    while( true ) {
      uVar18 = (ulong)(int)uVar18;
      piVar6 = array + uVar18;
      do {
        uVar18 = uVar18 + 1;
        iVar2 = piVar6[1];
        piVar6 = piVar6 + 1;
      } while (iVar2 < iVar11);
      param_2 = (ulong)(int)param_2;
      do {
        lVar12 = param_2 - 1;
        param_2 = param_2 - 1;
      } while (iVar11 < array[lVar12]);
      if ((long)param_2 <= (long)uVar18) break;
      *piVar6 = array[lVar12];
      array[param_2] = iVar2;
    }
    sort<int,Minisat::LessThan_default<int>>(array,uVar18 & 0xffffffff);
    param_2 = (ulong)(uVar10 - (int)uVar18);
    array = piVar6;
  }
  piVar6 = (int *)operator_new__(param_2 * 4);
  bVar8 = false;
  uVar18 = 0;
  iVar11 = 1;
  while (__dest = piVar6, iVar11 < (int)uVar10) {
    iVar2 = iVar11 * 2;
    piVar6 = __dest;
    for (uVar7 = 0; uVar1 = uVar7 + (long)iVar11, (long)uVar1 < (long)param_2;
        uVar7 = uVar7 + (long)iVar2) {
      uVar9 = iVar11 + (int)uVar1;
      if ((int)uVar10 <= (int)uVar9) {
        uVar9 = uVar10;
      }
      uVar15 = uVar7 & 0xffffffff;
      uVar14 = uVar1 & 0xffffffff;
      uVar18 = uVar7;
      piVar17 = piVar6;
      while( true ) {
        lVar16 = (long)(int)uVar15;
        iVar13 = (int)uVar14;
        lVar12 = (long)iVar13;
        if (((long)uVar1 <= lVar16) || ((int)uVar9 <= iVar13)) break;
        iVar3 = array[lVar16];
        iVar4 = array[iVar13];
        iVar5 = iVar4;
        if (iVar3 < iVar4) {
          iVar5 = iVar3;
        }
        uVar15 = (ulong)((int)uVar15 + (uint)(iVar3 < iVar4));
        uVar14 = (ulong)(iVar13 + (uint)(iVar4 <= iVar3));
        __dest[uVar18] = iVar5;
        uVar18 = uVar18 + 1;
        piVar17 = piVar17 + 1;
      }
      for (; lVar16 < (long)uVar1; lVar16 = lVar16 + 1) {
        __dest[uVar18] = array[lVar16];
        uVar18 = uVar18 + 1;
        piVar17 = piVar17 + 1;
      }
      for (; lVar12 < (int)uVar9; lVar12 = lVar12 + 1) {
        uVar18 = uVar18 + 1;
        *piVar17 = array[lVar12];
        piVar17 = piVar17 + 1;
      }
      piVar6 = piVar6 + iVar2;
    }
    for (uVar18 = (ulong)(int)uVar18; (long)uVar18 < (long)param_2; uVar18 = uVar18 + 1) {
      __dest[uVar18] = array[uVar18];
    }
    bVar8 = (bool)(bVar8 ^ 1);
    piVar6 = array;
    array = __dest;
    iVar11 = iVar2;
  }
  if (bVar8) {
    memcpy(__dest,array,param_2 * 4);
    __dest = array;
  }
  if (__dest == (int *)0x0) {
    return;
  }
  operator_delete__(__dest);
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}